

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiIO::ClearInputCharacters(ImGuiIO *this)

{
  int *piVar1;
  unsigned_short *puVar2;
  unsigned_short *__dest;
  int iVar3;
  int iVar4;
  
  iVar3 = (this->InputQueueCharacters).Capacity;
  if (iVar3 < 0) {
    iVar3 = iVar3 / 2 + iVar3;
    iVar4 = 0;
    if (0 < iVar3) {
      iVar4 = iVar3;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (unsigned_short *)(*GImAllocatorAllocFunc)((long)iVar4 * 2,GImAllocatorUserData);
    puVar2 = (this->InputQueueCharacters).Data;
    if (puVar2 != (unsigned_short *)0x0) {
      memcpy(__dest,puVar2,(long)(this->InputQueueCharacters).Size * 2);
      puVar2 = (this->InputQueueCharacters).Data;
      if ((puVar2 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar2,GImAllocatorUserData);
    }
    (this->InputQueueCharacters).Data = __dest;
    (this->InputQueueCharacters).Capacity = iVar4;
  }
  (this->InputQueueCharacters).Size = 0;
  return;
}

Assistant:

void ImGuiIO::ClearInputCharacters()
{
    InputQueueCharacters.resize(0);
}